

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu580.c
# Opt level: O0

MPP_RET hal_h264e_vepu580_get_task(void *hal,HalEncTask *task)

{
  long lVar1;
  long lVar2;
  EncRcTask *pEVar3;
  long lVar4;
  RK_U32 RVar5;
  RK_S32 RVar6;
  MppMeta meta_00;
  H264eSlice *slice_00;
  H264eSlice *slice;
  H264ePrefixNal *prefix;
  MppMeta meta;
  H264eFrmInfo *frms;
  EncFrmStatus *frm_status;
  RK_U32 updated;
  MppEncH264HwCfg *hw_cfg;
  MppEncRefCfgImpl *ref;
  MppEncCfgSet *cfg_set;
  HalH264eVepu580Ctx *ctx;
  HalEncTask *task_local;
  void *hal_local;
  
  lVar1 = *hal;
  lVar2 = *(long *)(lVar1 + 0xea0);
  RVar5 = update_vepu580_syntax((HalH264eVepu580Ctx *)hal,&task->syntax);
  pEVar3 = task->rc_task;
  lVar4 = *(long *)((long)hal + 0x78);
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","enter %p\n","hal_h264e_vepu580_get_task",hal);
  }
  if ((RVar5 & 1) != 0) {
    setup_hal_bufs((HalH264eVepu580Ctx *)hal);
  }
  if (((pEVar3->frm).val >> 0x22 & 1) == 0) {
    RVar6 = mpp_frame_has_meta(task->frame);
    if (RVar6 != 0) {
      meta_00 = mpp_frame_get_meta(task->frame);
      mpp_meta_get_ptr_d(meta_00,KEY_ROI_DATA2,(void **)((long)hal + 0x118),(void *)0x0);
      mpp_meta_get_ptr_d(meta_00,KEY_OSD_DATA,(void **)((long)hal + 0x158),(void *)0x0);
      mpp_meta_get_ptr_d(meta_00,KEY_OSD_DATA2,(void **)((long)hal + 0x160),(void *)0x0);
    }
  }
  if (*(long *)((long)hal + 0x70) != 0) {
    h264e_dpb_hal_start(*(H264eDpb **)((long)hal + 0x70),*(RK_S32 *)(lVar4 + 4));
    h264e_dpb_hal_start(*(H264eDpb **)((long)hal + 0x70),*(RK_S32 *)(lVar4 + 8));
  }
  (task->flags).reg_idx = *(RK_S32 *)((long)hal + 0x1c0);
  (task->flags).curr_idx = *(RK_S32 *)(lVar4 + 4);
  (task->flags).refr_idx = *(RK_S32 *)(lVar4 + 8);
  task->part_first = 1;
  task->part_last = 0;
  *(undefined8 *)((long)hal + 0x1f0) =
       *(undefined8 *)((long)hal + (long)*(int *)((long)hal + 0x1c0) * 8 + 0x48);
  *(long *)((long)hal + 0x1d0) =
       *(long *)((long)hal + 0x1a0) + (long)*(int *)((long)hal + 0x1c0) * 0x1cb8;
  *(long *)((long)hal + 0x1d8) =
       *(long *)((long)hal + 0x1a8) + (long)*(int *)((long)hal + 0x1c0) * 0x60;
  *(long *)((long)hal + 0x138) = *(long *)((long)hal + 0x1d0) + 0x1210;
  *(undefined4 *)(lVar1 + 0x364) = *(undefined4 *)(*(long *)((long)hal + 0x60) + 0x28);
  if ((*(uint *)((long)hal + 0x14) < 2) ||
     ((*(int *)(lVar2 + 0x1c) == 0 && (*(int *)(lVar2 + 0x20) < 2)))) {
    h264e_vepu_stream_amend_config
              (*(HalH264eVepuStreamAmend **)((long)hal + 0x1d8),task->packet,*hal,
               *(H264eSlice **)((long)hal + 0x1e8),*(H264ePrefixNal **)((long)hal + 0x1e0));
  }
  else {
    slice = (H264eSlice *)(*(long *)((long)hal + 0x1b0) + (long)*(int *)((long)hal + 0x1c0) * 0x28);
    slice_00 = (H264eSlice *)
               (*(long *)((long)hal + 0x1b8) + (long)*(int *)((long)hal + 0x1c0) * 0x90);
    if (*(long *)((long)hal + 0x1e0) == 0) {
      slice = (H264eSlice *)0x0;
    }
    else {
      memcpy(slice,*(void **)((long)hal + 0x1e0),0x28);
    }
    if (*(long *)((long)hal + 0x1e8) != 0) {
      memcpy(slice_00,*(void **)((long)hal + 0x1e8),0x90);
      *(undefined8 *)(*(long *)((long)hal + 0x1d8) + 0x18) = *(undefined8 *)((long)hal + 0x80);
      *(undefined8 *)(*(long *)((long)hal + 0x1d8) + 0x20) = *(undefined8 *)((long)hal + 0x88);
    }
    h264e_vepu_stream_amend_config
              (*(HalH264eVepuStreamAmend **)((long)hal + 0x1d8),task->packet,*hal,slice_00,
               (H264ePrefixNal *)slice);
  }
  if (1 < *(uint *)((long)hal + 0x14)) {
    *(uint *)((long)hal + 0x1c0) = (uint)((*(int *)((long)hal + 0x1c0) != 0 ^ 0xffU) & 1);
  }
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu580","leave %p\n","hal_h264e_vepu580_get_task",hal);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_h264e_vepu580_get_task(void *hal, HalEncTask *task)
{
    HalH264eVepu580Ctx *ctx = (HalH264eVepu580Ctx *)hal;
    MppEncCfgSet *cfg_set = ctx->cfg;
    MppEncRefCfgImpl *ref = (MppEncRefCfgImpl *)cfg_set->ref_cfg;
    MppEncH264HwCfg *hw_cfg = &cfg_set->codec.h264.hw_cfg;
    RK_U32 updated = update_vepu580_syntax(ctx, &task->syntax);
    EncFrmStatus *frm_status = &task->rc_task->frm;
    H264eFrmInfo *frms = ctx->frms;

    hal_h264e_dbg_func("enter %p\n", hal);

    if (updated & SYN_TYPE_FLAG(H264E_SYN_CFG))
        setup_hal_bufs(ctx);

    if (!frm_status->reencode && mpp_frame_has_meta(task->frame)) {
        MppMeta meta = mpp_frame_get_meta(task->frame);

        mpp_meta_get_ptr_d(meta, KEY_ROI_DATA2, (void **)&ctx->roi_data, NULL);
        mpp_meta_get_ptr_d(meta, KEY_OSD_DATA, (void **)&ctx->osd_cfg.osd_data, NULL);
        mpp_meta_get_ptr_d(meta, KEY_OSD_DATA2, (void **)&ctx->osd_cfg.osd_data2, NULL);
    }

    if (ctx->dpb) {
        h264e_dpb_hal_start(ctx->dpb, frms->curr_idx);
        h264e_dpb_hal_start(ctx->dpb, frms->refr_idx);
    }

    task->flags.reg_idx = ctx->task_idx;
    task->flags.curr_idx = frms->curr_idx;
    task->flags.refr_idx = frms->refr_idx;
    task->part_first = 1;
    task->part_last = 0;

    ctx->ext_line_buf = ctx->ext_line_bufs[ctx->task_idx];
    ctx->regs_set = &ctx->regs_sets[ctx->task_idx];
    ctx->amend = &ctx->amend_sets[ctx->task_idx];
    ctx->osd_cfg.reg_base = &ctx->regs_set->reg_osd;

    /* if not VEPU1/2, update log2_max_frame_num_minus4 in hw_cfg */
    hw_cfg->hw_log2_max_frame_num_minus4 = ctx->sps->log2_max_frame_num_minus4;

    if (ctx->task_cnt > 1 && (ref->lt_cfg_cnt || ref->st_cfg_cnt > 1)) {
        H264ePrefixNal *prefix = &ctx->prefix_sets[ctx->task_idx];
        H264eSlice *slice = &ctx->slice_sets[ctx->task_idx];

        //store async encode TSVC info
        if (ctx->prefix)
            memcpy(prefix, ctx->prefix, sizeof(H264ePrefixNal));
        else
            prefix = NULL;

        if (ctx->slice) {
            memcpy(slice, ctx->slice, sizeof(H264eSlice));

            /*
             * Generally, reorder and marking are shared by dpb and slice.
             * However, async encoding TSVC will change reorder and marking in each task.
             * Therefore, malloc a special space for async encoding TSVC.
             */
            ctx->amend->reorder = ctx->reorder;
            ctx->amend->marking = ctx->marking;
        }

        h264e_vepu_stream_amend_config(ctx->amend, task->packet, ctx->cfg,
                                       slice, prefix);
    } else {
        h264e_vepu_stream_amend_config(ctx->amend, task->packet, ctx->cfg,
                                       ctx->slice, ctx->prefix);
    }

    if (ctx->task_cnt > 1)
        ctx->task_idx = !ctx->task_idx;

    hal_h264e_dbg_func("leave %p\n", hal);

    return MPP_OK;
}